

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int it_read_envelope(IT_ENVELOPE *envelope,DUMBFILE *f)

{
  int iVar1;
  int iVar2;
  DUMBFILE *in_RSI;
  byte *in_RDI;
  int n;
  DUMBFILE *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  iVar1 = dumbfile_getc(in_stack_ffffffffffffffd8);
  *in_RDI = (byte)iVar1;
  iVar1 = dumbfile_getc(in_stack_ffffffffffffffd8);
  in_RDI[1] = (byte)iVar1;
  if (in_RDI[1] < 0x1a) {
    iVar1 = dumbfile_getc(in_stack_ffffffffffffffd8);
    in_RDI[2] = (byte)iVar1;
    iVar1 = dumbfile_getc(in_stack_ffffffffffffffd8);
    in_RDI[3] = (byte)iVar1;
    iVar1 = dumbfile_getc(in_stack_ffffffffffffffd8);
    in_RDI[4] = (byte)iVar1;
    iVar1 = dumbfile_getc(in_stack_ffffffffffffffd8);
    in_RDI[5] = (byte)iVar1;
    for (iVar1 = 0; iVar1 < (int)(uint)in_RDI[1]; iVar1 = iVar1 + 1) {
      iVar2 = dumbfile_getc(in_stack_ffffffffffffffd8);
      in_RDI[(long)iVar1 + 6] = (byte)iVar2;
      iVar2 = dumbfile_igetw(in_stack_ffffffffffffffd8);
      *(short *)(in_RDI + (long)iVar1 * 2 + 0x20) = (short)iVar2;
    }
    dumbfile_skip(in_RSI,CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    if (in_RDI[1] == 0) {
      *in_RDI = *in_RDI & 0xfe;
    }
    else {
      if ((in_RDI[1] <= in_RDI[3]) || (in_RDI[3] < in_RDI[2])) {
        *in_RDI = *in_RDI & 0xfd;
      }
      if ((in_RDI[1] <= in_RDI[5]) || (in_RDI[5] < in_RDI[4])) {
        *in_RDI = *in_RDI & 0xfb;
      }
    }
    local_4 = dumbfile_error(in_RSI);
  }
  else {
    in_RDI[1] = 0;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int it_read_envelope(IT_ENVELOPE *envelope, DUMBFILE *f)
{
	int n;

	envelope->flags = dumbfile_getc(f);
	envelope->n_nodes = dumbfile_getc(f);
	if(envelope->n_nodes > 25) {
		TRACE("IT error: wrong number of envelope nodes (%d)\n", envelope->n_nodes);
		envelope->n_nodes = 0;
		return -1;
	}
	envelope->loop_start = dumbfile_getc(f);
	envelope->loop_end = dumbfile_getc(f);
	envelope->sus_loop_start = dumbfile_getc(f);
	envelope->sus_loop_end = dumbfile_getc(f);
	for (n = 0; n < envelope->n_nodes; n++) {
		envelope->node_y[n] = dumbfile_getc(f);
		envelope->node_t[n] = dumbfile_igetw(f);
	}
	dumbfile_skip(f, 75 - envelope->n_nodes * 3 + 1);

	if (envelope->n_nodes <= 0)
		envelope->flags &= ~IT_ENVELOPE_ON;
	else {
		if (envelope->loop_end >= envelope->n_nodes || envelope->loop_start > envelope->loop_end) envelope->flags &= ~IT_ENVELOPE_LOOP_ON;
		if (envelope->sus_loop_end >= envelope->n_nodes || envelope->sus_loop_start > envelope->sus_loop_end) envelope->flags &= ~IT_ENVELOPE_SUSTAIN_LOOP;
	}

	return dumbfile_error(f);
}